

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

double __thiscall despot::BaseTag::StepReward(BaseTag *this,Belief *belief,ACT_TYPE action)

{
  int iVar1;
  value_type pSVar2;
  ACT_TYPE AVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  size_type sVar4;
  const_reference ppSVar5;
  const_reference pvVar6;
  double local_50;
  double reward;
  TagState *state;
  State *particle;
  double dStack_30;
  int i;
  double sum;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  ACT_TYPE action_local;
  Belief *belief_local;
  BaseTag *this_local;
  
  this_00 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
            (**(code **)(*(long *)belief + 0x30))();
  dStack_30 = 0.0;
  for (particle._4_4_ = 0;
      sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_00),
      (ulong)(long)particle._4_4_ < sVar4; particle._4_4_ = particle._4_4_ + 1) {
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_00,(long)particle._4_4_);
    pSVar2 = *ppSVar5;
    AVar3 = TagAction(this);
    if (action == AVar3) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->rob_,(long)*(int *)(pSVar2 + 0xc));
      iVar1 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->opp_,(long)*(int *)(pSVar2 + 0xc));
      if (iVar1 == *pvVar6) {
        local_50 = TAG_REWARD;
      }
      else {
        local_50 = -TAG_REWARD;
      }
    }
    else {
      local_50 = -1.0;
    }
    dStack_30 = *(double *)(pSVar2 + 0x18) * local_50 + dStack_30;
  }
  return dStack_30;
}

Assistant:

double BaseTag::StepReward(const Belief* belief, ACT_TYPE action) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		TagState* state = static_cast<TagState*>(particle);
		double reward = 0;
		if (action == TagAction()) {
			if (rob_[state->state_id] == opp_[state->state_id]) {
				reward = TAG_REWARD;
			} else {
				reward = -TAG_REWARD;
			}
		} else {
			reward = -1;
		}
		sum += state->weight * reward;
	}

	return sum;
}